

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Widget_Type.cxx
# Opt level: O0

void __thiscall Fl_Widget_Type::copy_properties(Fl_Widget_Type *this)

{
  Fl_Widget *this_00;
  Fl_Button *this_01;
  Fl_Button *this_02;
  Fl_Input_ *this_03;
  Fl_Value_Input *this_04;
  Fl_Text_Display *this_05;
  Fl_Valuator *this_06;
  Fl_Valuator *this_07;
  Fl_Slider *this_08;
  Fl_Spinner *this_09;
  Fl_Spinner *this_10;
  uchar uVar1;
  char cVar2;
  Fl_Boxtype FVar3;
  Fl_Color FVar4;
  Fl_Labeltype a;
  Fl_Font f;
  Fl_Fontsize pix;
  Fl_Align alignment;
  int iVar5;
  uint uVar6;
  char *pcVar7;
  Fl_Group *pFVar8;
  float fVar9;
  double dVar10;
  Fl_Spinner *s_6;
  Fl_Spinner *d_6;
  Fl_Slider *s_5;
  Fl_Slider *d_5;
  Fl_Valuator *s_4;
  Fl_Valuator *d_4;
  Fl_Text_Display *s_3;
  Fl_Text_Display *d_3;
  Fl_Value_Input *s_2;
  Fl_Value_Input *d_2;
  Fl_Input_ *s_1;
  Fl_Input_ *d_1;
  Fl_Button *s;
  Fl_Button *d;
  Fl_Widget *w;
  Fl_Widget_Type *this_local;
  
  if (this->live_widget != (Fl_Widget *)0x0) {
    this_00 = this->live_widget;
    pcVar7 = Fl_Widget::label(this->o);
    Fl_Widget::label(this_00,pcVar7);
    pcVar7 = tooltip(this);
    Fl_Widget::tooltip(this_00,pcVar7);
    uVar1 = Fl_Widget::type(this->o);
    Fl_Widget::type(this_00,uVar1);
    FVar3 = Fl_Widget::box(this->o);
    Fl_Widget::box(this_00,FVar3);
    FVar4 = Fl_Widget::color(this->o);
    Fl_Widget::color(this_00,FVar4);
    FVar4 = Fl_Widget::selection_color(this->o);
    Fl_Widget::selection_color(this_00,FVar4);
    a = Fl_Widget::labeltype(this->o);
    Fl_Widget::labeltype(this_00,a);
    f = Fl_Widget::labelfont(this->o);
    Fl_Widget::labelfont(this_00,f);
    pix = Fl_Widget::labelsize(this->o);
    Fl_Widget::labelsize(this_00,pix);
    FVar4 = Fl_Widget::labelcolor(this->o);
    Fl_Widget::labelcolor(this_00,FVar4);
    alignment = Fl_Widget::align(this->o);
    Fl_Widget::align(this_00,alignment);
    iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x18])();
    if (iVar5 != 0) {
      this_01 = (Fl_Button *)this->live_widget;
      this_02 = (Fl_Button *)this->o;
      FVar3 = Fl_Button::down_box(this_02);
      Fl_Button::down_box(this_01,FVar3);
      iVar5 = Fl_Button::shortcut(this_02);
      Fl_Button::shortcut(this_01,iVar5);
      cVar2 = Fl_Button::value(this_02);
      Fl_Button::value(this_01,(int)cVar2);
    }
    iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x19])();
    if (iVar5 != 0) {
      this_03 = (Fl_Input_ *)this->live_widget;
      iVar5 = Fl_Input_::shortcut((Fl_Input_ *)this->o);
      Fl_Input_::shortcut(this_03,iVar5);
    }
    iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1a])();
    if (iVar5 != 0) {
      this_04 = (Fl_Value_Input *)this->live_widget;
      iVar5 = Fl_Value_Input::shortcut((Fl_Value_Input *)this->o);
      Fl_Value_Input::shortcut(this_04,iVar5);
    }
    iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1b])();
    if (iVar5 != 0) {
      this_05 = (Fl_Text_Display *)this->live_widget;
      iVar5 = Fl_Text_Display::shortcut((Fl_Text_Display *)this->o);
      Fl_Text_Display::shortcut(this_05,iVar5);
    }
    iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])();
    if (iVar5 != 0) {
      this_06 = (Fl_Valuator *)this->live_widget;
      this_07 = (Fl_Valuator *)this->o;
      dVar10 = Fl_Valuator::minimum(this_07);
      Fl_Valuator::minimum(this_06,dVar10);
      dVar10 = Fl_Valuator::maximum(this_07);
      Fl_Valuator::maximum(this_06,dVar10);
      dVar10 = Fl_Valuator::step(this_07);
      Fl_Valuator::step(this_06,dVar10);
      dVar10 = Fl_Valuator::value(this_07);
      Fl_Valuator::value(this_06,dVar10);
      iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1c])();
      if (1 < iVar5) {
        this_08 = (Fl_Slider *)this->live_widget;
        fVar9 = Fl_Slider::slider_size((Fl_Slider *)this->o);
        Fl_Slider::slider_size(this_08,(double)fVar9);
      }
    }
    iVar5 = (*(this->super_Fl_Type)._vptr_Fl_Type[0x1d])();
    if (iVar5 != 0) {
      this_09 = (Fl_Spinner *)this->live_widget;
      this_10 = (Fl_Spinner *)this->o;
      dVar10 = Fl_Spinner::minimum(this_10);
      Fl_Spinner::minimum(this_09,dVar10);
      dVar10 = Fl_Spinner::maximum(this_10);
      Fl_Spinner::maximum(this_09,dVar10);
      dVar10 = Fl_Spinner::step(this_10);
      Fl_Spinner::step(this_09,dVar10);
      dVar10 = Fl_Spinner::value(this_10);
      Fl_Spinner::value(this_09,dVar10);
    }
    uVar6 = Fl_Widget::visible(this->o);
    if (uVar6 == 0) {
      (*this_00->_vptr_Fl_Widget[6])();
    }
    uVar6 = Fl_Widget::active(this->o);
    if (uVar6 == 0) {
      Fl_Widget::deactivate(this_00);
    }
    uVar1 = resizable(this);
    if ((uVar1 != '\0') && (pFVar8 = Fl_Widget::parent(this_00), pFVar8 != (Fl_Group *)0x0)) {
      pFVar8 = Fl_Widget::parent(this_00);
      Fl_Group::resizable(pFVar8,this->o);
    }
  }
  return;
}

Assistant:

void Fl_Widget_Type::copy_properties() {
  if (!live_widget) 
    return;

  // copy all attributes common to all widget types
  Fl_Widget *w = live_widget;
  w->label(o->label());
  w->tooltip(tooltip());
  w->type(o->type());
  w->box(o->box());
  w->color(o->color());
  w->selection_color(o->selection_color());
  w->labeltype(o->labeltype());
  w->labelfont(o->labelfont());
  w->labelsize(o->labelsize());
  w->labelcolor(o->labelcolor());
  w->align(o->align());

  // copy all attributes specific to widgets derived from Fl_Button
  if (is_button()) {
    Fl_Button* d = (Fl_Button*)live_widget, *s = (Fl_Button*)o;
    d->down_box(s->down_box());
    d->shortcut(s->shortcut());
    d->value(s->value());
  }

  // copy all attributes specific to widgets derived from Fl_Input_
  if (is_input()) {
    Fl_Input_* d = (Fl_Input_*)live_widget, *s = (Fl_Input_*)o;
    d->shortcut(s->shortcut());
  }

  // copy all attributes specific to widgets derived from Fl_Value_Input
  if (is_value_input()) {
    Fl_Value_Input* d = (Fl_Value_Input*)live_widget, *s = (Fl_Value_Input*)o;
    d->shortcut(s->shortcut());
  }

  // copy all attributes specific to widgets derived from Fl_Text_Display
  if (is_text_display()) {
    Fl_Text_Display* d = (Fl_Text_Display*)live_widget, *s = (Fl_Text_Display*)o;
    d->shortcut(s->shortcut());
  }

  // copy all attributes specific to Fl_Valuator and derived classes
  if (is_valuator()) {
    Fl_Valuator* d = (Fl_Valuator*)live_widget, *s = (Fl_Valuator*)o;
    d->minimum(s->minimum());
    d->maximum(s->maximum());
    d->step(s->step());
    d->value(s->value());
    if (is_valuator()>=2) {
      Fl_Slider *d = (Fl_Slider*)live_widget, *s = (Fl_Slider*)o;
      d->slider_size(s->slider_size());
    }
  }

  // copy all attributes specific to Fl_Spinner and derived classes
  if (is_spinner()) {
    Fl_Spinner* d = (Fl_Spinner*)live_widget, *s = (Fl_Spinner*)o;
    d->minimum(s->minimum());
    d->maximum(s->maximum());
    d->step(s->step());
    d->value(s->value());
  }
 
/* TODO: implement this
  {Fl_Font ff; int fs; Fl_Color fc; if (textstuff(4,ff,fs,fc)) {
    Fl_Font f; int s; Fl_Color c; textstuff(0,f,s,c);
    if (f != ff) write_string("textfont %d", f);
    if (s != fs) write_string("textsize %d", s);
    if (c != fc) write_string("textcolor %d", c);
  }}*/

  if (!o->visible()) 
    w->hide();
  if (!o->active()) 
    w->deactivate();
  if (resizable() && w->parent()) 
    w->parent()->resizable(o);
}